

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall Parser::printError<>(Parser *this,Token *token,char *text)

{
  string local_40;
  char *local_20;
  char *text_local;
  Token *token_local;
  Parser *this_local;
  
  local_20 = text;
  text_local = (char *)token;
  token_local = (Token *)this;
  tinyformat::format<>(&local_40,text);
  printError(this,token,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void printError(const Token& token, const char* text, const Args&... args)
	{
		printError(token, tfm::format(text,args...));
	}